

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

stbi_uc * dds_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  uint32 uVar2;
  uint32 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool local_16e;
  uint local_16c;
  uint uStack_168;
  uchar temp;
  int my_1;
  int mx_1;
  int my;
  int mx;
  int block_size;
  int idx;
  int ref_y;
  int ref_x;
  int bh;
  int bw;
  int by;
  int bx;
  int cf;
  int sz;
  int i;
  DDS_header header;
  int num_blocks;
  int block_pitch;
  int cubemap_faces;
  int is_compressed;
  int has_mipmap;
  int has_alpha;
  int DXT_family;
  int flags;
  stbi_uc compressed [8];
  stbi_uc block [64];
  stbi *local_40;
  stbi_uc *dds_data;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi *s_local;
  
  getn(s,(stbi_uc *)&sz,0x80);
  if (sz == 0x20534444) {
    if (i == 0x7c) {
      if ((header.dwMagic & 0x1007) == 0x1007) {
        if (header.dwReserved1[9] == 0x20) {
          if ((header.dwReserved1[10] & 0x44) == 0) {
            s_local = (stbi *)0x0;
          }
          else if ((header.sPixelFormat.dwBBitMask & 0x1000) == 0) {
            s_local = (stbi *)0x0;
          }
          else {
            s->img_x = header.dwFlags;
            s->img_y = header.dwSize;
            s->img_n = 4;
            local_16e = (header.sPixelFormat.dwBBitMask & 0x400000) != 0 &&
                        1 < header.dwPitchOrLinearSize;
            iVar5 = ((uint)(s->img_x == s->img_y) &
                    (header.sPixelFormat.dwAlphaBitMask & 0x200) >> 9) * 5 + 1;
            header.dwReserved2 = s->img_x + 3 >> 2;
            header.sCaps.dwReserved = header.dwReserved2 * (s->img_y + 3 >> 2);
            *x = s->img_x;
            *y = s->img_y;
            *comp = s->img_n;
            if ((header.dwReserved1[10] & 4) == 0) {
              s->img_n = 3;
              if ((header.dwReserved1[10] & 1) != 0) {
                s->img_n = 4;
              }
              *comp = s->img_n;
              bx = s->img_x * s->img_y * s->img_n * iVar5;
              local_40 = (stbi *)malloc((long)bx);
              for (by = 0; by < iVar5; by = by + 1) {
                getn(s,(stbi_uc *)
                       ((long)&local_40->img_x + (ulong)(by * s->img_x * s->img_y * s->img_n)),
                     s->img_x * s->img_y * s->img_n);
                if (local_16e) {
                  for (cf = 1; (uint)cf < header.dwPitchOrLinearSize; cf = cf + 1) {
                    uStack_168 = s->img_x >> ((byte)cf & 0x1f);
                    local_16c = s->img_y >> ((byte)cf & 0x1f);
                    if ((int)uStack_168 < 1) {
                      uStack_168 = 1;
                    }
                    if ((int)local_16c < 1) {
                      local_16c = 1;
                    }
                    skip(s,uStack_168 * local_16c * s->img_n);
                  }
                }
              }
              for (cf = 0; cf < bx; cf = s->img_n + cf) {
                uVar1 = *(uchar *)((long)&local_40->img_x + (long)cf);
                *(uchar *)((long)&local_40->img_x + (long)cf) =
                     *(uchar *)((long)&local_40->img_x + (long)(cf + 2));
                *(uchar *)((long)&local_40->img_x + (long)(cf + 2)) = uVar1;
              }
            }
            else {
              iVar6 = (header.sPixelFormat.dwSize >> 0x18) - 0x30;
              if ((iVar6 < 1) || (5 < iVar6)) {
                return (stbi_uc *)0x0;
              }
              bx = s->img_x * s->img_y * 4 * iVar5;
              local_40 = (stbi *)malloc((long)bx);
              for (by = 0; by < iVar5; by = by + 1) {
                for (cf = 0; cf < (int)header.sCaps.dwReserved; cf = cf + 1) {
                  ref_x = 4;
                  ref_y = 4;
                  iVar9 = cf % (int)header.dwReserved2;
                  iVar10 = iVar9 * 4;
                  iVar7 = cf / (int)header.dwReserved2;
                  iVar8 = iVar7 * 4;
                  if (iVar6 == 1) {
                    getn(s,(stbi_uc *)&DXT_family,8);
                    stbi_decode_DXT1_block(compressed,(uchar *)&DXT_family);
                  }
                  else if (iVar6 < 4) {
                    getn(s,(stbi_uc *)&DXT_family,8);
                    stbi_decode_DXT23_alpha_block(compressed,(uchar *)&DXT_family);
                    getn(s,(stbi_uc *)&DXT_family,8);
                    stbi_decode_DXT_color_block(compressed,(uchar *)&DXT_family);
                  }
                  else {
                    getn(s,(stbi_uc *)&DXT_family,8);
                    stbi_decode_DXT45_alpha_block(compressed,(uchar *)&DXT_family);
                    getn(s,(stbi_uc *)&DXT_family,8);
                    stbi_decode_DXT_color_block(compressed,(uchar *)&DXT_family);
                  }
                  if (s->img_x < iVar10 + 4U) {
                    ref_x = s->img_x + iVar9 * -4;
                  }
                  if (s->img_y < iVar8 + 4U) {
                    ref_y = s->img_y + iVar7 * -4;
                  }
                  for (bh = 0; bh < ref_y; bh = bh + 1) {
                    uVar2 = s->img_x;
                    uVar3 = s->img_x;
                    for (bw = 0; bw < ref_x * 4; bw = bw + 1) {
                      *(stbi_uc *)
                       ((long)&local_40->img_x +
                       (long)(int)(((iVar8 + bh + by * uVar2) * uVar3 + iVar10) * 4 + bw)) =
                           compressed[bh * 0x10 + bw];
                    }
                  }
                }
                if (local_16e) {
                  my = 0x10;
                  if (iVar6 == 1) {
                    my = 8;
                  }
                  for (cf = 1; (uint)cf < header.dwPitchOrLinearSize; cf = cf + 1) {
                    mx_1 = s->img_x >> ((char)cf + 2U & 0x1f);
                    my_1 = s->img_y >> ((char)cf + 2U & 0x1f);
                    if (mx_1 < 1) {
                      mx_1 = 1;
                    }
                    if (my_1 < 1) {
                      my_1 = 1;
                    }
                    skip(s,mx_1 * my_1 * my);
                  }
                }
              }
            }
            s->img_y = iVar5 * s->img_y;
            *y = s->img_y;
            bVar4 = false;
            if (s->img_n == 4) {
              for (cf = 3; cf < bx && !bVar4; cf = cf + 4) {
                bVar4 = (bool)(*(uchar *)((long)&local_40->img_x + (long)cf) != 0xff | bVar4);
              }
            }
            if ((req_comp < 5) && (0 < req_comp)) {
              if (req_comp != s->img_n) {
                local_40 = (stbi *)convert_format((uchar *)local_40,s->img_n,req_comp,s->img_x,
                                                  s->img_y);
                *comp = s->img_n;
              }
            }
            else if ((!bVar4) && (s->img_n == 4)) {
              local_40 = (stbi *)convert_format((uchar *)local_40,4,3,s->img_x,s->img_y);
              *comp = 3;
            }
            s_local = local_40;
          }
        }
        else {
          s_local = (stbi *)0x0;
        }
      }
      else {
        s_local = (stbi *)0x0;
      }
    }
    else {
      s_local = (stbi *)0x0;
    }
  }
  else {
    s_local = (stbi *)0x0;
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *dds_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	all variables go up front
	stbi_uc *dds_data = NULL;
	stbi_uc block[16*4];
	stbi_uc compressed[8];
	int flags, DXT_family;
	int has_alpha, has_mipmap;
	int is_compressed, cubemap_faces;
	int block_pitch, num_blocks;
	DDS_header header;
	int i, sz, cf;
	//	load the header
	if( sizeof( DDS_header ) != 128 )
	{
		return NULL;
	}
	getn( s, (stbi_uc*)(&header), 128 );
	//	and do some checking
	if( header.dwMagic != (('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24)) ) return NULL;
	if( header.dwSize != 124 ) return NULL;
	flags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flags) != flags ) return NULL;
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	if( header.sPixelFormat.dwSize != 32 ) return NULL;
	flags = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flags) == 0 ) return NULL;
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) return NULL;
	//	get the image data
	s->img_x = header.dwWidth;
	s->img_y = header.dwHeight;
	s->img_n = 4;
	is_compressed = (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	has_alpha = (header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS) / DDPF_ALPHAPIXELS;
	has_mipmap = (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1);
	cubemap_faces = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	/*	I need cubemaps to have square faces	*/
	cubemap_faces &= (s->img_x == s->img_y);
	cubemap_faces *= 5;
	cubemap_faces += 1;
	block_pitch = (s->img_x+3) >> 2;
	num_blocks = block_pitch * ((s->img_y+3) >> 2);
	/*	let the user know what's going on	*/
	*x = s->img_x;
	*y = s->img_y;
	*comp = s->img_n;
	/*	is this uncompressed?	*/
	if( is_compressed )
	{
		/*	compressed	*/
		//	note: header.sPixelFormat.dwFourCC is something like (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))
		DXT_family = 1 + (header.sPixelFormat.dwFourCC >> 24) - '1';
		if( (DXT_family < 1) || (DXT_family > 5) ) return NULL;
		/*	check the expected size...oops, nevermind...
			those non-compliant writers leave
			dwPitchOrLinearSize == 0	*/
		//	passed all the tests, get the RAM for decoding
		sz = (s->img_x)*(s->img_y)*4*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			//	now read and decode all the blocks
			for( i = 0; i < num_blocks; ++i )
			{
				//	where are we?
				int bx, by, bw=4, bh=4;
				int ref_x = 4 * (i % block_pitch);
				int ref_y = 4 * (i / block_pitch);
				//	get the next block's worth of compressed data, and decompress it
				if( DXT_family == 1 )
				{
					//	DXT1
					getn( s, compressed, 8 );
					stbi_decode_DXT1_block( block, compressed );
				} else if( DXT_family < 4 )
				{
					//	DXT2/3
					getn( s, compressed, 8 );
					stbi_decode_DXT23_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				} else
				{
					//	DXT4/5
					getn( s, compressed, 8 );
					stbi_decode_DXT45_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				}
				//	is this a partial block?
				if( ref_x + 4 > s->img_x )
				{
					bw = s->img_x - ref_x;
				}
				if( ref_y + 4 > s->img_y )
				{
					bh = s->img_y - ref_y;
				}
				//	now drop our decompressed data into the buffer
				for( by = 0; by < bh; ++by )
				{
					int idx = 4*((ref_y+by+cf*s->img_x)*s->img_x + ref_x);
					for( bx = 0; bx < bw*4; ++bx )
					{

						dds_data[idx+bx] = block[by*16+bx];
					}
				}
			}
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				int block_size = 16;
				if( DXT_family == 1 )
				{
					block_size = 8;
				}
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> (i + 2);
					int my = s->img_y >> (i + 2);
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*block_size );
				}
			}
		}/* per cubemap face */
	} else
	{
		/*	uncompressed	*/
		DXT_family = 0;
		s->img_n = 3;
		if( has_alpha )
		{
			s->img_n = 4;
		}
		*comp = s->img_n;
		sz = s->img_x*s->img_y*s->img_n*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			/*	read the main image for this face	*/
			getn( s, &dds_data[cf*s->img_x*s->img_y*s->img_n], s->img_x*s->img_y*s->img_n );
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> i;
					int my = s->img_y >> i;
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*s->img_n );
				}
			}
		}
		/*	data was BGR, I need it RGB	*/
		for( i = 0; i < sz; i += s->img_n )
		{
			unsigned char temp = dds_data[i];
			dds_data[i] = dds_data[i+2];
			dds_data[i+2] = temp;
		}
	}
	/*	finished decompressing into RGBA,
		adjust the y size if we have a cubemap
		note: sz is already up to date	*/
	s->img_y *= cubemap_faces;
	*y = s->img_y;
	//	did the user want something else, or
	//	see if all the alpha values are 255 (i.e. no transparency)
	has_alpha = 0;
	if( s->img_n == 4)
	{
		for( i = 3; (i < sz) && (has_alpha == 0); i += 4 )
		{
			has_alpha |= (dds_data[i] < 255);
		}
	}
	if( (req_comp <= 4) && (req_comp >= 1) )
	{
		//	user has some requirements, meet them
		if( req_comp != s->img_n )
		{
			dds_data = convert_format( dds_data, s->img_n, req_comp, s->img_x, s->img_y );
			*comp = s->img_n;
		}
	} else
	{
		//	user had no requirements, only drop to RGB is no alpha
		if( (has_alpha == 0) && (s->img_n == 4) )
		{
			dds_data = convert_format( dds_data, 4, 3, s->img_x, s->img_y );
			*comp = 3;
		}
	}
	//	OK, done
	return dds_data;
}